

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::RunContext::handleFatalErrorCondition(RunContext *this,string *message)

{
  size_t *psVar1;
  TestCase *_name;
  IStreamingReporter *pIVar2;
  pointer pcVar3;
  Totals deltaTotals;
  SectionInfo testCaseSection;
  Counts assertions;
  SectionStats testCaseSectionStats;
  TestCaseInfo testInfo;
  ResultBuilder resultBuilder;
  string local_6f8;
  string local_6d8;
  Totals local_6b8;
  SectionInfo local_680;
  undefined1 local_618 [8];
  _Alloc_hider local_610;
  undefined1 local_608 [24];
  undefined4 local_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5e0;
  undefined4 local_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_5c0 [19];
  Counts local_488;
  SectionStats local_470;
  TestCaseInfo local_3d8;
  ResultBuilder local_2c8;
  
  ResultBuilder::ResultBuilder
            (&local_2c8,(this->m_lastAssertionInfo).macroName._M_dataplus._M_p,
             &(this->m_lastAssertionInfo).lineInfo,
             (this->m_lastAssertionInfo).capturedExpression._M_dataplus._M_p,
             (this->m_lastAssertionInfo).resultDisposition,"");
  local_2c8.m_data.resultType = FatalErrorCondition;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_2c8.m_stream,(message->_M_dataplus)._M_p,message->_M_string_length);
  ResultBuilder::captureExpression(&local_2c8);
  handleUnfinishedSections(this);
  _name = this->m_activeTestCase;
  SectionInfo::SectionInfo
            (&local_680,&(_name->super_TestCaseInfo).lineInfo,(string *)_name,
             &(_name->super_TestCaseInfo).description);
  local_488.passed = 0;
  local_488.failedButOk = 0;
  local_488.failed = 1;
  SectionStats::SectionStats(&local_470,&local_680,&local_488,0.0,false);
  pIVar2 = (this->m_reporter).m_p;
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xc])(pIVar2,&local_470);
  TestCaseInfo::TestCaseInfo(&local_3d8,&this->m_activeTestCase->super_TestCaseInfo);
  local_6b8.testCases.failedButOk = 0;
  local_6b8.assertions.failedButOk = 0;
  local_6b8.testCases.passed = 0;
  local_6b8.assertions.passed = 0;
  local_6b8.assertions.failed = 0;
  local_6b8.testCases.failed = 1;
  pIVar2 = (this->m_reporter).m_p;
  local_6d8._M_dataplus._M_p = (pointer)&local_6d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6d8,"");
  local_6f8._M_dataplus._M_p = (pointer)&local_6f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_6f8,"");
  TestCaseStats::TestCaseStats
            ((TestCaseStats *)local_618,&local_3d8,&local_6b8,&local_6d8,&local_6f8,false);
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xd])(pIVar2,local_618);
  TestCaseStats::~TestCaseStats((TestCaseStats *)local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8._M_dataplus._M_p != &local_6f8.field_2) {
    operator_delete(local_6f8._M_dataplus._M_p,local_6f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6d8._M_dataplus._M_p != &local_6d8.field_2) {
    operator_delete(local_6d8._M_dataplus._M_p,local_6d8.field_2._M_allocated_capacity + 1);
  }
  psVar1 = &(this->m_totals).testCases.failed;
  *psVar1 = *psVar1 + 1;
  local_618 = (undefined1  [8])local_608;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_618,"");
  testGroupEnded(this,(string *)local_618,&this->m_totals,1,1);
  if (local_618 != (undefined1  [8])local_608) {
    operator_delete((void *)local_618,(ulong)(local_608._0_8_ + 1));
  }
  pIVar2 = (this->m_reporter).m_p;
  local_618 = (undefined1  [8])&PTR__TestRunStats_0017d6b8;
  pcVar3 = (this->m_runInfo).name._M_dataplus._M_p;
  local_610._M_p = local_608 + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_610,pcVar3,pcVar3 + (this->m_runInfo).name._M_string_length);
  local_5f0 = (undefined4)(this->m_totals).assertions.passed;
  uStack_5ec = *(undefined4 *)((long)&(this->m_totals).assertions.passed + 4);
  uStack_5e8 = (undefined4)(this->m_totals).assertions.failed;
  uStack_5e4 = *(undefined4 *)((long)&(this->m_totals).assertions.failed + 4);
  local_5e0._M_allocated_capacity._0_4_ = (undefined4)(this->m_totals).assertions.failedButOk;
  local_5e0._M_allocated_capacity._4_4_ =
       *(undefined4 *)((long)&(this->m_totals).assertions.failedButOk + 4);
  local_5e0._8_4_ = (undefined4)(this->m_totals).testCases.passed;
  local_5e0._12_4_ = *(undefined4 *)((long)&(this->m_totals).testCases.passed + 4);
  local_5d0 = (undefined4)(this->m_totals).testCases.failed;
  uStack_5cc = *(undefined4 *)((long)&(this->m_totals).testCases.failed + 4);
  uStack_5c8 = (undefined4)(this->m_totals).testCases.failedButOk;
  uStack_5c4 = *(undefined4 *)((long)&(this->m_totals).testCases.failedButOk + 4);
  local_5c0[0]._M_local_buf[0] = '\0';
  (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2);
  local_618 = (undefined1  [8])&PTR__TestRunStats_0017d6b8;
  if (local_610._M_p != local_608 + 8) {
    operator_delete(local_610._M_p,local_608._8_8_ + 1);
  }
  TestCaseInfo::~TestCaseInfo(&local_3d8);
  SectionStats::~SectionStats(&local_470);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680.lineInfo.file._M_dataplus._M_p != &local_680.lineInfo.file.field_2) {
    operator_delete(local_680.lineInfo.file._M_dataplus._M_p,
                    local_680.lineInfo.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680.description._M_dataplus._M_p != &local_680.description.field_2) {
    operator_delete(local_680.description._M_dataplus._M_p,
                    local_680.description.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_680.name._M_dataplus._M_p != &local_680.name.field_2) {
    operator_delete(local_680.name._M_dataplus._M_p,local_680.name.field_2._M_allocated_capacity + 1
                   );
  }
  ResultBuilder::~ResultBuilder(&local_2c8);
  return;
}

Assistant:

virtual void handleFatalErrorCondition( std::string const& message ) {
            ResultBuilder resultBuilder = makeUnexpectedResultBuilder();
            resultBuilder.setResultType( ResultWas::FatalErrorCondition );
            resultBuilder << message;
            resultBuilder.captureExpression();

            handleUnfinishedSections();

            // Recreate section for test case (as we will lose the one that was in scope)
            TestCaseInfo const& testCaseInfo = m_activeTestCase->getTestCaseInfo();
            SectionInfo testCaseSection( testCaseInfo.lineInfo, testCaseInfo.name, testCaseInfo.description );

            Counts assertions;
            assertions.failed = 1;
            SectionStats testCaseSectionStats( testCaseSection, assertions, 0, false );
            m_reporter->sectionEnded( testCaseSectionStats );

            TestCaseInfo testInfo = m_activeTestCase->getTestCaseInfo();

            Totals deltaTotals;
            deltaTotals.testCases.failed = 1;
            m_reporter->testCaseEnded( TestCaseStats(   testInfo,
                                                        deltaTotals,
                                                        "",
                                                        "",
                                                        false ) );
            m_totals.testCases.failed++;
            testGroupEnded( "", m_totals, 1, 1 );
            m_reporter->testRunEnded( TestRunStats( m_runInfo, m_totals, false ) );
        }